

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseExpression(State *state)

{
  undefined8 uVar1;
  bool bVar2;
  int local_5c;
  undefined4 uStack_58;
  int arity;
  ParseState copy2;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar2 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar2) {
    state_local._7_1_ = false;
  }
  else {
    bVar2 = ParseTemplateParam(guard.state_);
    if ((bVar2) || (bVar2 = ParseExprPrimary(guard.state_), bVar2)) {
      state_local._7_1_ = true;
    }
    else {
      copy2.prev_name_idx = ((guard.state_)->parse_state).mangled_idx;
      copy2._12_4_ = ((guard.state_)->parse_state).out_cur_idx;
      uVar1 = *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx;
      bVar2 = ParseTwoCharToken(guard.state_,"cl");
      if ((bVar2) &&
         ((bVar2 = OneOrMore(ParseExpression,guard.state_), bVar2 &&
          (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2)))) {
        state_local._7_1_ = true;
      }
      else {
        ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
        ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
        bVar2 = ParseThreeCharToken(guard.state_,"pp_");
        if (((bVar2) || (bVar2 = ParseThreeCharToken(guard.state_,"mm_"), bVar2)) &&
           (bVar2 = ParseExpression(guard.state_), bVar2)) {
          state_local._7_1_ = true;
        }
        else {
          ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
          ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
          *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
          bVar2 = ParseTwoCharToken(guard.state_,"cp");
          if (((bVar2) && (bVar2 = ParseSimpleId(guard.state_), bVar2)) &&
             ((bVar2 = ZeroOrMore(ParseExpression,guard.state_), bVar2 &&
              (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2)))) {
            state_local._7_1_ = true;
          }
          else {
            ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
            ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
            *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
            bVar2 = ParseTwoCharToken(guard.state_,"so");
            if (((bVar2) && (bVar2 = ParseType(guard.state_), bVar2)) &&
               (bVar2 = ParseExpression(guard.state_), bVar2)) {
              bVar2 = ParseNumber(guard.state_,(int *)0x0);
              bVar2 = Optional(bVar2);
              if ((bVar2) && (bVar2 = ZeroOrMore(ParseUnionSelector,guard.state_), bVar2)) {
                bVar2 = ParseOneCharToken(guard.state_,'p');
                bVar2 = Optional(bVar2);
                if ((bVar2) && (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2)) {
                  state_local._7_1_ = true;
                  goto LAB_006bf984;
                }
              }
            }
            ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
            ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
            *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
            bVar2 = ParseFunctionParam(guard.state_);
            if (bVar2) {
              state_local._7_1_ = true;
            }
            else {
              ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
              ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
              *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
              bVar2 = ParseTwoCharToken(guard.state_,"tl");
              if ((((bVar2) && (bVar2 = ParseType(guard.state_), bVar2)) &&
                  (bVar2 = ZeroOrMore(ParseBracedExpression,guard.state_), bVar2)) &&
                 (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2)) {
                state_local._7_1_ = true;
              }
              else {
                ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                bVar2 = ParseTwoCharToken(guard.state_,"il");
                if (((bVar2) && (bVar2 = ZeroOrMore(ParseBracedExpression,guard.state_), bVar2)) &&
                   (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2)) {
                  state_local._7_1_ = true;
                }
                else {
                  ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                  ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                  *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                  bVar2 = ParseTwoCharToken(guard.state_,"gs");
                  bVar2 = Optional(bVar2);
                  if (((((bVar2) &&
                        ((bVar2 = ParseTwoCharToken(guard.state_,"nw"), bVar2 ||
                         (bVar2 = ParseTwoCharToken(guard.state_,"na"), bVar2)))) &&
                       (bVar2 = ZeroOrMore(ParseExpression,guard.state_), bVar2)) &&
                      ((bVar2 = ParseOneCharToken(guard.state_,'_'), bVar2 &&
                       (bVar2 = ParseType(guard.state_), bVar2)))) &&
                     ((bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2 ||
                      (bVar2 = ParseInitializer(guard.state_), bVar2)))) {
                    state_local._7_1_ = true;
                  }
                  else {
                    ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                    ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                    *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                    bVar2 = ParseTwoCharToken(guard.state_,"gs");
                    bVar2 = Optional(bVar2);
                    if ((bVar2) &&
                       (((bVar2 = ParseTwoCharToken(guard.state_,"dl"), bVar2 ||
                         (bVar2 = ParseTwoCharToken(guard.state_,"da"), bVar2)) &&
                        (bVar2 = ParseExpression(guard.state_), bVar2)))) {
                      state_local._7_1_ = true;
                    }
                    else {
                      ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                      ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                      *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                      bVar2 = ParseCharClass(guard.state_,"dscr");
                      if (((bVar2) && (bVar2 = ParseOneCharToken(guard.state_,'c'), bVar2)) &&
                         ((bVar2 = ParseType(guard.state_), bVar2 &&
                          (bVar2 = ParseExpression(guard.state_), bVar2)))) {
                        state_local._7_1_ = true;
                      }
                      else {
                        ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                        ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                        bVar2 = ParseTwoCharToken(guard.state_,"cv");
                        if (bVar2) {
                          bVar2 = ParseType(guard.state_);
                          if (bVar2) {
                            uStack_58 = ((guard.state_)->parse_state).mangled_idx;
                            arity = ((guard.state_)->parse_state).out_cur_idx;
                            copy2.mangled_idx = ((guard.state_)->parse_state).prev_name_idx;
                            copy2.out_cur_idx = *(int *)&((guard.state_)->parse_state).field_0xc;
                            bVar2 = ParseOneCharToken(guard.state_,'_');
                            if (((bVar2) &&
                                (bVar2 = ZeroOrMore(ParseExpression,guard.state_), bVar2)) &&
                               (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2)) {
                              state_local._7_1_ = true;
                              goto LAB_006bf984;
                            }
                            ((guard.state_)->parse_state).mangled_idx = uStack_58;
                            ((guard.state_)->parse_state).out_cur_idx = arity;
                            ((guard.state_)->parse_state).prev_name_idx = copy2.mangled_idx;
                            *(int *)&((guard.state_)->parse_state).field_0xc = copy2.out_cur_idx;
                            bVar2 = ParseExpression(guard.state_);
                            if (bVar2) {
                              state_local._7_1_ = true;
                              goto LAB_006bf984;
                            }
                          }
                        }
                        else {
                          local_5c = -1;
                          bVar2 = ParseOperatorName(guard.state_,&local_5c);
                          if ((((bVar2) && (0 < local_5c)) &&
                              (((local_5c < 3 || (bVar2 = ParseExpression(guard.state_), bVar2)) &&
                               ((local_5c < 2 || (bVar2 = ParseExpression(guard.state_), bVar2))))))
                             && ((local_5c < 1 || (bVar2 = ParseExpression(guard.state_), bVar2))))
                          {
                            state_local._7_1_ = true;
                            goto LAB_006bf984;
                          }
                        }
                        ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                        ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                        bVar2 = ParseTwoCharToken(guard.state_,"ti");
                        if ((bVar2) && (bVar2 = ParseType(guard.state_), bVar2)) {
                          state_local._7_1_ = true;
                        }
                        else {
                          ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                          ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                          *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                          bVar2 = ParseTwoCharToken(guard.state_,"te");
                          if ((bVar2) && (bVar2 = ParseExpression(guard.state_), bVar2)) {
                            state_local._7_1_ = true;
                          }
                          else {
                            ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                            ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                            *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                            bVar2 = ParseTwoCharToken(guard.state_,"st");
                            if ((bVar2) && (bVar2 = ParseType(guard.state_), bVar2)) {
                              state_local._7_1_ = true;
                            }
                            else {
                              ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                              ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                              *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                              bVar2 = ParseTwoCharToken(guard.state_,"at");
                              if ((bVar2) && (bVar2 = ParseType(guard.state_), bVar2)) {
                                state_local._7_1_ = true;
                              }
                              else {
                                ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                                ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                                *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx = uVar1;
                                bVar2 = ParseTwoCharToken(guard.state_,"az");
                                if ((bVar2) && (bVar2 = ParseExpression(guard.state_), bVar2)) {
                                  state_local._7_1_ = true;
                                }
                                else {
                                  ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                                  ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                                  *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx =
                                       uVar1;
                                  bVar2 = ParseTwoCharToken(guard.state_,"nx");
                                  if ((bVar2) && (bVar2 = ParseExpression(guard.state_), bVar2)) {
                                    state_local._7_1_ = true;
                                  }
                                  else {
                                    ((guard.state_)->parse_state).mangled_idx = copy2.prev_name_idx;
                                    ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                                    *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx =
                                         uVar1;
                                    bVar2 = ParseTwoCharToken(guard.state_,"sZ");
                                    if ((bVar2) &&
                                       ((bVar2 = ParseFunctionParam(guard.state_), bVar2 ||
                                        (bVar2 = ParseTemplateParam(guard.state_), bVar2)))) {
                                      state_local._7_1_ = true;
                                    }
                                    else {
                                      ((guard.state_)->parse_state).mangled_idx =
                                           copy2.prev_name_idx;
                                      ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                                      *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx =
                                           uVar1;
                                      bVar2 = ParseTwoCharToken(guard.state_,"sP");
                                      if (((bVar2) &&
                                          (bVar2 = ZeroOrMore(ParseTemplateArg,guard.state_), bVar2)
                                          ) && (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2))
                                      {
                                        state_local._7_1_ = true;
                                      }
                                      else {
                                        ((guard.state_)->parse_state).mangled_idx =
                                             copy2.prev_name_idx;
                                        ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                                        *(undefined8 *)&((guard.state_)->parse_state).prev_name_idx
                                             = uVar1;
                                        bVar2 = ParseTwoCharToken(guard.state_,"fl");
                                        if (((bVar2) ||
                                            (bVar2 = ParseTwoCharToken(guard.state_,"fr"), bVar2))
                                           && ((bVar2 = ParseOperatorName(guard.state_,(int *)0x0),
                                               bVar2 && (bVar2 = ParseExpression(guard.state_),
                                                        bVar2)))) {
                                          state_local._7_1_ = true;
                                        }
                                        else {
                                          ((guard.state_)->parse_state).mangled_idx =
                                               copy2.prev_name_idx;
                                          ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_;
                                          *(undefined8 *)
                                           &((guard.state_)->parse_state).prev_name_idx = uVar1;
                                          bVar2 = ParseTwoCharToken(guard.state_,"fL");
                                          if (((bVar2) ||
                                              (bVar2 = ParseTwoCharToken(guard.state_,"fR"), bVar2))
                                             && ((bVar2 = ParseOperatorName(guard.state_,(int *)0x0)
                                                 , bVar2 &&
                                                 ((bVar2 = ParseExpression(guard.state_), bVar2 &&
                                                  (bVar2 = ParseExpression(guard.state_), bVar2)))))
                                             ) {
                                            state_local._7_1_ = true;
                                          }
                                          else {
                                            ((guard.state_)->parse_state).mangled_idx =
                                                 copy2.prev_name_idx;
                                            ((guard.state_)->parse_state).out_cur_idx = copy2._12_4_
                                            ;
                                            *(undefined8 *)
                                             &((guard.state_)->parse_state).prev_name_idx = uVar1;
                                            bVar2 = ParseTwoCharToken(guard.state_,"tw");
                                            if ((bVar2) &&
                                               (bVar2 = ParseExpression(guard.state_), bVar2)) {
                                              state_local._7_1_ = true;
                                            }
                                            else {
                                              ((guard.state_)->parse_state).mangled_idx =
                                                   copy2.prev_name_idx;
                                              ((guard.state_)->parse_state).out_cur_idx =
                                                   copy2._12_4_;
                                              *(undefined8 *)
                                               &((guard.state_)->parse_state).prev_name_idx = uVar1;
                                              bVar2 = ParseTwoCharToken(guard.state_,"tr");
                                              if (bVar2) {
                                                state_local._7_1_ = true;
                                              }
                                              else {
                                                bVar2 = ParseTwoCharToken(guard.state_,"dt");
                                                if ((((bVar2) ||
                                                     (bVar2 = ParseTwoCharToken(guard.state_,"pt"),
                                                     bVar2)) &&
                                                    (bVar2 = ParseExpression(guard.state_), bVar2))
                                                   && (bVar2 = ParseUnresolvedName(guard.state_),
                                                      bVar2)) {
                                                  state_local._7_1_ = true;
                                                }
                                                else {
                                                  ((guard.state_)->parse_state).mangled_idx =
                                                       copy2.prev_name_idx;
                                                  ((guard.state_)->parse_state).out_cur_idx =
                                                       copy2._12_4_;
                                                  *(undefined8 *)
                                                   &((guard.state_)->parse_state).prev_name_idx =
                                                       uVar1;
                                                  bVar2 = ParseTwoCharToken(guard.state_,"ds");
                                                  if (((bVar2) &&
                                                      (bVar2 = ParseExpression(guard.state_), bVar2)
                                                      ) && (bVar2 = ParseExpression(guard.state_),
                                                           bVar2)) {
                                                    state_local._7_1_ = true;
                                                  }
                                                  else {
                                                    ((guard.state_)->parse_state).mangled_idx =
                                                         copy2.prev_name_idx;
                                                    ((guard.state_)->parse_state).out_cur_idx =
                                                         copy2._12_4_;
                                                    *(undefined8 *)
                                                     &((guard.state_)->parse_state).prev_name_idx =
                                                         uVar1;
                                                    bVar2 = ParseTwoCharToken(guard.state_,"sp");
                                                    if ((bVar2) &&
                                                       (bVar2 = ParseExpression(guard.state_), bVar2
                                                       )) {
                                                      state_local._7_1_ = true;
                                                    }
                                                    else {
                                                      ((guard.state_)->parse_state).mangled_idx =
                                                           copy2.prev_name_idx;
                                                      ((guard.state_)->parse_state).out_cur_idx =
                                                           copy2._12_4_;
                                                      *(undefined8 *)
                                                       &((guard.state_)->parse_state).prev_name_idx
                                                           = uVar1;
                                                      bVar2 = ParseOneCharToken(guard.state_,'u');
                                                      if ((((bVar2) &&
                                                           (bVar2 = ParseSourceName(guard.state_),
                                                           bVar2)) &&
                                                          (bVar2 = ZeroOrMore(ParseTemplateArg,
                                                                              guard.state_), bVar2))
                                                         && (bVar2 = ParseOneCharToken(guard.state_,
                                                                                       'E'), bVar2))
                                                      {
                                                        state_local._7_1_ = true;
                                                      }
                                                      else {
                                                        ((guard.state_)->parse_state).mangled_idx =
                                                             copy2.prev_name_idx;
                                                        ((guard.state_)->parse_state).out_cur_idx =
                                                             copy2._12_4_;
                                                        *(undefined8 *)
                                                         &((guard.state_)->parse_state).
                                                          prev_name_idx = uVar1;
                                                        bVar2 = ParseTwoCharToken(guard.state_,"rq")
                                                        ;
                                                        if (((bVar2) &&
                                                            (bVar2 = OneOrMore(ParseRequirement,
                                                                               guard.state_), bVar2)
                                                            ) && (bVar2 = ParseOneCharToken(guard.
                                                  state_,'E'), bVar2)) {
                                                    state_local._7_1_ = true;
                                                  }
                                                  else {
                                                    ((guard.state_)->parse_state).mangled_idx =
                                                         copy2.prev_name_idx;
                                                    ((guard.state_)->parse_state).out_cur_idx =
                                                         copy2._12_4_;
                                                    *(undefined8 *)
                                                     &((guard.state_)->parse_state).prev_name_idx =
                                                         uVar1;
                                                    bVar2 = ParseTwoCharToken(guard.state_,"rQ");
                                                    if (((bVar2) &&
                                                        (bVar2 = ParseBareFunctionType(guard.state_)
                                                        , bVar2)) &&
                                                       ((bVar2 = ParseOneCharToken(guard.state_,'_')
                                                        , bVar2 &&
                                                        ((bVar2 = OneOrMore(ParseRequirement,
                                                                            guard.state_), bVar2 &&
                                                         (bVar2 = ParseOneCharToken(guard.state_,'E'
                                                                                   ), bVar2)))))) {
                                                      state_local._7_1_ = true;
                                                    }
                                                    else {
                                                      ((guard.state_)->parse_state).mangled_idx =
                                                           copy2.prev_name_idx;
                                                      ((guard.state_)->parse_state).out_cur_idx =
                                                           copy2._12_4_;
                                                      *(undefined8 *)
                                                       &((guard.state_)->parse_state).prev_name_idx
                                                           = uVar1;
                                                      state_local._7_1_ =
                                                           ParseUnresolvedName(guard.state_);
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_006bf984:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseExpression(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  ParseState copy = state->parse_state;

  // Object/function call expression.
  if (ParseTwoCharToken(state, "cl") && OneOrMore(ParseExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Preincrement and predecrement.  Postincrement and postdecrement are handled
  // by the operator-name logic later on.
  if ((ParseThreeCharToken(state, "pp_") ||
       ParseThreeCharToken(state, "mm_")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Clang-specific "cp <simple-id> <expression>* E"
  //   https://clang.llvm.org/doxygen/ItaniumMangle_8cpp_source.html#l04338
  if (ParseTwoCharToken(state, "cp") && ParseSimpleId(state) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= so <type> <expression> [<number>] <union-selector>* [p] E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/47
  if (ParseTwoCharToken(state, "so") && ParseType(state) &&
      ParseExpression(state) && Optional(ParseNumber(state, nullptr)) &&
      ZeroOrMore(ParseUnionSelector, state) &&
      Optional(ParseOneCharToken(state, 'p')) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= <function-param>
  if (ParseFunctionParam(state)) return true;
  state->parse_state = copy;

  // <expression> ::= tl <type> <braced-expression>* E
  if (ParseTwoCharToken(state, "tl") && ParseType(state) &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= il <braced-expression>* E
  if (ParseTwoCharToken(state, "il") &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] nw <expression>* _ <type> E
  //              ::= [gs] nw <expression>* _ <type> <initializer>
  //              ::= [gs] na <expression>* _ <type> E
  //              ::= [gs] na <expression>* _ <type> <initializer>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "nw") || ParseTwoCharToken(state, "na")) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, '_') &&
      ParseType(state) &&
      (ParseOneCharToken(state, 'E') || ParseInitializer(state))) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] dl <expression>
  //              ::= [gs] da <expression>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "dl") || ParseTwoCharToken(state, "da")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // dynamic_cast, static_cast, const_cast, reinterpret_cast.
  //
  // <expression> ::= (dc | sc | cc | rc) <type> <expression>
  if (ParseCharClass(state, "dscr") && ParseOneCharToken(state, 'c') &&
      ParseType(state) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parse the conversion expressions jointly to avoid re-parsing the <type> in
  // their common prefix.  Parsed as:
  // <expression> ::= cv <type> <conversion-args>
  // <conversion-args> ::= _ <expression>* E
  //                   ::= <expression>
  //
  // Also don't try ParseOperatorName after seeing "cv", since ParseOperatorName
  // also needs to accept "cv <type>" in other contexts.
  if (ParseTwoCharToken(state, "cv")) {
    if (ParseType(state)) {
      ParseState copy2 = state->parse_state;
      if (ParseOneCharToken(state, '_') && ZeroOrMore(ParseExpression, state) &&
          ParseOneCharToken(state, 'E')) {
        return true;
      }
      state->parse_state = copy2;
      if (ParseExpression(state)) {
        return true;
      }
    }
  } else {
    // Parse unary, binary, and ternary operator expressions jointly, taking
    // care not to re-parse subexpressions repeatedly. Parse like:
    //   <expression> ::= <operator-name> <expression>
    //                    [<one-to-two-expressions>]
    //   <one-to-two-expressions> ::= <expression> [<expression>]
    int arity = -1;
    if (ParseOperatorName(state, &arity) &&
        arity > 0 &&  // 0 arity => disabled.
        (arity < 3 || ParseExpression(state)) &&
        (arity < 2 || ParseExpression(state)) &&
        (arity < 1 || ParseExpression(state))) {
      return true;
    }
  }
  state->parse_state = copy;

  // typeid(type)
  if (ParseTwoCharToken(state, "ti") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // typeid(expression)
  if (ParseTwoCharToken(state, "te") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof type
  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(type)
  if (ParseTwoCharToken(state, "at") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(expression), a GNU extension
  if (ParseTwoCharToken(state, "az") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // noexcept(expression) appearing as an expression in a dependent signature
  if (ParseTwoCharToken(state, "nx") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack)
  //
  // <expression> ::= sZ <template-param>
  //              ::= sZ <function-param>
  if (ParseTwoCharToken(state, "sZ") &&
      (ParseFunctionParam(state) || ParseTemplateParam(state))) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack) captured from an alias template
  //
  // <expression> ::= sP <template-arg>* E
  if (ParseTwoCharToken(state, "sP") && ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Unary folds (... op pack) and (pack op ...).
  //
  // <expression> ::= fl <binary operator-name> <expression>
  //              ::= fr <binary operator-name> <expression>
  if ((ParseTwoCharToken(state, "fl") || ParseTwoCharToken(state, "fr")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Binary folds (init op ... op pack) and (pack op ... op init).
  //
  // <expression> ::= fL <binary operator-name> <expression> <expression>
  //              ::= fR <binary operator-name> <expression> <expression>
  if ((ParseTwoCharToken(state, "fL") || ParseTwoCharToken(state, "fR")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tw <expression>: throw e
  if (ParseTwoCharToken(state, "tw") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tr: throw (rethrows an exception from the handler that caught it)
  if (ParseTwoCharToken(state, "tr")) return true;

  // Object and pointer member access expressions.
  //
  // <expression> ::= (dt | pt) <expression> <unresolved-name>
  if ((ParseTwoCharToken(state, "dt") || ParseTwoCharToken(state, "pt")) &&
      ParseExpression(state) && ParseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Pointer-to-member access expressions.  This parses the same as a binary
  // operator, but it's implemented separately because "ds" shouldn't be
  // accepted in other contexts that parse an operator name.
  if (ParseTwoCharToken(state, "ds") && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parameter pack expansion
  if (ParseTwoCharToken(state, "sp") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Vendor extended expressions
  if (ParseOneCharToken(state, 'u') && ParseSourceName(state) &&
      ZeroOrMore(ParseTemplateArg, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rq <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rq") && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rQ <bare-function-type> _ <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rQ") && ParseBareFunctionType(state) &&
      ParseOneCharToken(state, '_') && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return ParseUnresolvedName(state);
}